

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAEngine.h
# Opt level: O1

void __thiscall
Js::SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::SCAEngine
          (SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *this,
          SerializationCloner<Js::StreamWriter> *cloner,Var *m_transferableVars,
          size_t cTransferableVars)

{
  Recycler *this_00;
  Recycler *alloc;
  ClonedObjectDictionary *pCVar1;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  this->m_cloner = cloner;
  this->m_transferableVars = m_transferableVars;
  this->m_cTransferableVars = cTransferableVars;
  this_00 = ((cloner->
             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ).super_ScriptContextHolder.m_scriptContext)->recycler;
  local_48 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<void*,unsigned_int,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_aca7f51;
  data.filename._0_4_ = 0x2a;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_48);
  pCVar1 = (ClonedObjectDictionary *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  (pCVar1->buckets).ptr = (int *)0x0;
  (pCVar1->entries).ptr = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<void>,_unsigned_int> *)0x0;
  pCVar1->alloc = this_00;
  pCVar1->size = 0;
  pCVar1->bucketCount = 0;
  pCVar1->count = 0;
  pCVar1->freeCount = 0;
  pCVar1->modFunctionIndex = 0x4b;
  pCVar1->stats = (Type)0x0;
  this->m_clonedObjects = pCVar1;
  ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>::
  SetEngine(&this->m_cloner->
             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
            ,this);
  return;
}

Assistant:

SCAEngine(Cloner* cloner, Var* m_transferableVars, size_t cTransferableVars)
            : m_cloner(cloner),
            m_transferableVars(m_transferableVars),
            m_cTransferableVars(cTransferableVars)
        {
            Recycler* recycler = cloner->GetScriptContext()->GetRecycler();
            m_clonedObjects = RecyclerNew(recycler, ClonedObjectDictionary, recycler);
            m_cloner->SetEngine(this);
        }